

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O3

tommy_trie_node *
trie_bucket_remove_existing
          (tommy_trie *trie,tommy_uint_t shift,tommy_trie_node **let_ptr,tommy_trie_node *remove,
          tommy_key_t key)

{
  code **ppcVar1;
  tommy_node_struct *ptVar2;
  tommy_allocator *ptVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  tommy_node_struct *ptVar7;
  tommy_allocator_entry_struct *ptVar8;
  undefined4 in_register_00000034;
  tommy_node_struct *ptVar9;
  tommy_node *head;
  tommy_node_struct *ptVar10;
  ulong uVar11;
  bool bVar12;
  tommy_node_struct *ptVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  tommy_trie_node **let_back [10];
  code *apcStack_70 [12];
  long local_10;
  
  ptVar9 = (tommy_node_struct *)CONCAT44(in_register_00000034,shift);
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar10 = ptVar9->next;
  if (ptVar10 != (tommy_node_struct *)0x0) {
    bVar6 = 0x1b;
    uVar5 = 0;
    do {
      if (((ulong)ptVar10 & 1) == 0) {
        if ((let_ptr != (tommy_trie_node **)0x0) ||
           (let_ptr = &ptVar10->next, ptVar10->key == (uint)remove)) {
          ptVar2 = ((tommy_trie_node *)let_ptr)->next;
          ptVar7 = ((tommy_trie_node *)let_ptr)->prev;
          ptVar13 = ptVar2;
          if (ptVar2 == (tommy_node_struct *)0x0) {
            ptVar13 = ptVar10;
          }
          ptVar13->prev = ptVar7;
          if (ptVar10 == (tommy_node_struct *)let_ptr) {
            ptVar7 = ptVar9;
          }
          ptVar7->next = ptVar2;
          if ((int)uVar5 != 0 && ptVar9->next == (tommy_node_struct *)0x0) {
            do {
              ppcVar1 = apcStack_70 + uVar5;
              uVar5 = uVar5 - 1;
              ptVar8 = (tommy_allocator_entry_struct *)(*(long *)*ppcVar1 + -1);
              bVar6 = 1;
              bVar12 = false;
              uVar4 = 0;
              uVar11 = 0;
              do {
                while (uVar14 = uVar4, ptVar8[uVar14].next != (tommy_allocator_entry_struct *)0x0) {
                  if (!(bool)(((ulong)ptVar8[uVar14].next & 1) == 0 & bVar6)) goto LAB_001052b0;
                  bVar12 = true;
                  bVar6 = 0;
                  uVar4 = uVar14 + 1;
                  uVar11 = uVar14;
                  if (uVar14 == 7) {
                    uVar11 = 7;
                    goto LAB_00105372;
                  }
                }
                uVar4 = uVar14 + 1;
              } while (uVar14 + 1 != 8);
              if (!bVar12) {
                apcStack_70[0] = (code *)0x1053c2;
                __assert_fail("count == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrie.c"
                              ,0xee,
                              "tommy_trie_node *trie_bucket_remove_existing(tommy_trie *, tommy_uint_t, tommy_trie_node **, tommy_trie_node *, tommy_key_t)"
                             );
              }
LAB_00105372:
              *(tommy_allocator_entry_struct **)*ppcVar1 = ptVar8[uVar11 & 0xffffffff].next;
              ptVar3 = trie->alloc;
              ptVar8->next = ptVar3->free_block;
              ptVar3->free_block = ptVar8;
              ptVar3->count = ptVar3->count - 1;
              trie->node_count = trie->node_count - 1;
            } while (uVar5 != 0);
          }
          goto LAB_001052b0;
        }
        break;
      }
      apcStack_70[uVar5 + 1] = (code *)ptVar9;
      ptVar9 = (tommy_node_struct *)
               ((long)ptVar10 + (ulong)((uint)remove >> (bVar6 & 0x1f) & 7) * 8 + -1);
      bVar6 = bVar6 - 3;
      ptVar10 = ptVar9->next;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (ptVar10 != (tommy_node_struct *)0x0);
  }
  let_ptr = (tommy_trie_node **)0x0;
LAB_001052b0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    apcStack_70[0] = tommy_trie_remove_existing;
    __stack_chk_fail();
  }
  return (tommy_trie_node *)let_ptr;
}

Assistant:

static tommy_trie_node* trie_bucket_remove_existing(tommy_trie* trie, tommy_uint_t shift, tommy_trie_node** let_ptr, tommy_trie_node* remove, tommy_key_t key)
{
	tommy_trie_node* node;
	tommy_trie_tree* tree;
	void* ptr;
	tommy_trie_node** let_back[TOMMY_TRIE_LEVEL_MAX + 1];
	tommy_uint_t level;
	tommy_uint_t i;
	tommy_uint_t count;
	tommy_uint_t last;

	level = 0;
recurse:
	ptr = *let_ptr;

	if (!ptr)
		return 0;

	if (trie_get_type(ptr) == TOMMY_TRIE_TYPE_TREE) {
		tree = trie_get_tree(ptr);

		/* save the path */
		let_back[level++] = let_ptr;

		/* go down one level */
		let_ptr = &tree->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;

		goto recurse;
	}

	node = tommy_cast(tommy_trie_node*, ptr);

	/* if the node to remove is not specified */
	if (!remove) {
		/* remove the first */
		remove = node;

		/* check if it's really the element to remove */
		if (remove->key != key)
			return 0;
	}

	tommy_list_remove_existing(let_ptr, remove);

	/* if the list is not empty, try to reduce */
	if (*let_ptr || !level)
		return remove;

reduce:
	/* go one level up */
	let_ptr = let_back[--level];

	tree = trie_get_tree(*let_ptr);

	/* check if there is only one child node */
	count = 0;
	last = 0;
	for (i = 0; i < TOMMY_TRIE_TREE_MAX; ++i) {
		if (tree->map[i]) {
			/* if we have a sub tree, we cannot reduce */
			if (trie_get_type(tree->map[i]) != TOMMY_TRIE_TYPE_NODE)
				return remove;
			/* if more than one node, we cannot reduce */
			if (++count > 1)
				return remove;
			last = i;
		}
	}

	/* here count is never 0, as we cannot have a tree with only one sub node */
	assert(count == 1);

	*let_ptr = tree->map[last];

	tommy_allocator_free(trie->alloc, tree);
	--trie->node_count;

	/* repeat until more level */
	if (level)
		goto reduce;

	return remove;
}